

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void InterruptHTTPServer(void)

{
  long lVar1;
  bool bVar2;
  Logger *this;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this,HTTP,Debug);
  if (bVar2) {
    logging_function._M_str = "InterruptHTTPServer";
    logging_function._M_len = 0x13;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<>(logging_function,source_file,0x1f8,HTTP,Debug,"Interrupting HTTP server\n");
  }
  if (eventHTTP != (evhttp *)0x0) {
    evhttp_set_gencb(eventHTTP,http_reject_request_cb,0);
  }
  if ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)
      g_work_queue._M_t.
      super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
      .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    WorkQueue<HTTPClosure>::Interrupt
              ((WorkQueue<HTTPClosure> *)
               g_work_queue._M_t.
               super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
               .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InterruptHTTPServer()
{
    LogDebug(BCLog::HTTP, "Interrupting HTTP server\n");
    if (eventHTTP) {
        // Reject requests on current connections
        evhttp_set_gencb(eventHTTP, http_reject_request_cb, nullptr);
    }
    if (g_work_queue) {
        g_work_queue->Interrupt();
    }
}